

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ARB_fragment_program(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ARB_fragment_program != 0) {
    glad_glProgramStringARB = (PFNGLPROGRAMSTRINGARBPROC)(*load)("glProgramStringARB");
    glad_glBindProgramARB = (PFNGLBINDPROGRAMARBPROC)(*load)("glBindProgramARB");
    glad_glDeleteProgramsARB = (PFNGLDELETEPROGRAMSARBPROC)(*load)("glDeleteProgramsARB");
    glad_glGenProgramsARB = (PFNGLGENPROGRAMSARBPROC)(*load)("glGenProgramsARB");
    glad_glProgramEnvParameter4dARB =
         (PFNGLPROGRAMENVPARAMETER4DARBPROC)(*load)("glProgramEnvParameter4dARB");
    glad_glProgramEnvParameter4dvARB =
         (PFNGLPROGRAMENVPARAMETER4DVARBPROC)(*load)("glProgramEnvParameter4dvARB");
    glad_glProgramEnvParameter4fARB =
         (PFNGLPROGRAMENVPARAMETER4FARBPROC)(*load)("glProgramEnvParameter4fARB");
    glad_glProgramEnvParameter4fvARB =
         (PFNGLPROGRAMENVPARAMETER4FVARBPROC)(*load)("glProgramEnvParameter4fvARB");
    glad_glProgramLocalParameter4dARB =
         (PFNGLPROGRAMLOCALPARAMETER4DARBPROC)(*load)("glProgramLocalParameter4dARB");
    glad_glProgramLocalParameter4dvARB =
         (PFNGLPROGRAMLOCALPARAMETER4DVARBPROC)(*load)("glProgramLocalParameter4dvARB");
    glad_glProgramLocalParameter4fARB =
         (PFNGLPROGRAMLOCALPARAMETER4FARBPROC)(*load)("glProgramLocalParameter4fARB");
    glad_glProgramLocalParameter4fvARB =
         (PFNGLPROGRAMLOCALPARAMETER4FVARBPROC)(*load)("glProgramLocalParameter4fvARB");
    glad_glGetProgramEnvParameterdvARB =
         (PFNGLGETPROGRAMENVPARAMETERDVARBPROC)(*load)("glGetProgramEnvParameterdvARB");
    glad_glGetProgramEnvParameterfvARB =
         (PFNGLGETPROGRAMENVPARAMETERFVARBPROC)(*load)("glGetProgramEnvParameterfvARB");
    glad_glGetProgramLocalParameterdvARB =
         (PFNGLGETPROGRAMLOCALPARAMETERDVARBPROC)(*load)("glGetProgramLocalParameterdvARB");
    glad_glGetProgramLocalParameterfvARB =
         (PFNGLGETPROGRAMLOCALPARAMETERFVARBPROC)(*load)("glGetProgramLocalParameterfvARB");
    glad_glGetProgramivARB = (PFNGLGETPROGRAMIVARBPROC)(*load)("glGetProgramivARB");
    glad_glGetProgramStringARB = (PFNGLGETPROGRAMSTRINGARBPROC)(*load)("glGetProgramStringARB");
    glad_glIsProgramARB = (PFNGLISPROGRAMARBPROC)(*load)("glIsProgramARB");
  }
  return;
}

Assistant:

static void load_GL_ARB_fragment_program(GLADloadproc load) {
	if(!GLAD_GL_ARB_fragment_program) return;
	glad_glProgramStringARB = (PFNGLPROGRAMSTRINGARBPROC)load("glProgramStringARB");
	glad_glBindProgramARB = (PFNGLBINDPROGRAMARBPROC)load("glBindProgramARB");
	glad_glDeleteProgramsARB = (PFNGLDELETEPROGRAMSARBPROC)load("glDeleteProgramsARB");
	glad_glGenProgramsARB = (PFNGLGENPROGRAMSARBPROC)load("glGenProgramsARB");
	glad_glProgramEnvParameter4dARB = (PFNGLPROGRAMENVPARAMETER4DARBPROC)load("glProgramEnvParameter4dARB");
	glad_glProgramEnvParameter4dvARB = (PFNGLPROGRAMENVPARAMETER4DVARBPROC)load("glProgramEnvParameter4dvARB");
	glad_glProgramEnvParameter4fARB = (PFNGLPROGRAMENVPARAMETER4FARBPROC)load("glProgramEnvParameter4fARB");
	glad_glProgramEnvParameter4fvARB = (PFNGLPROGRAMENVPARAMETER4FVARBPROC)load("glProgramEnvParameter4fvARB");
	glad_glProgramLocalParameter4dARB = (PFNGLPROGRAMLOCALPARAMETER4DARBPROC)load("glProgramLocalParameter4dARB");
	glad_glProgramLocalParameter4dvARB = (PFNGLPROGRAMLOCALPARAMETER4DVARBPROC)load("glProgramLocalParameter4dvARB");
	glad_glProgramLocalParameter4fARB = (PFNGLPROGRAMLOCALPARAMETER4FARBPROC)load("glProgramLocalParameter4fARB");
	glad_glProgramLocalParameter4fvARB = (PFNGLPROGRAMLOCALPARAMETER4FVARBPROC)load("glProgramLocalParameter4fvARB");
	glad_glGetProgramEnvParameterdvARB = (PFNGLGETPROGRAMENVPARAMETERDVARBPROC)load("glGetProgramEnvParameterdvARB");
	glad_glGetProgramEnvParameterfvARB = (PFNGLGETPROGRAMENVPARAMETERFVARBPROC)load("glGetProgramEnvParameterfvARB");
	glad_glGetProgramLocalParameterdvARB = (PFNGLGETPROGRAMLOCALPARAMETERDVARBPROC)load("glGetProgramLocalParameterdvARB");
	glad_glGetProgramLocalParameterfvARB = (PFNGLGETPROGRAMLOCALPARAMETERFVARBPROC)load("glGetProgramLocalParameterfvARB");
	glad_glGetProgramivARB = (PFNGLGETPROGRAMIVARBPROC)load("glGetProgramivARB");
	glad_glGetProgramStringARB = (PFNGLGETPROGRAMSTRINGARBPROC)load("glGetProgramStringARB");
	glad_glIsProgramARB = (PFNGLISPROGRAMARBPROC)load("glIsProgramARB");
}